

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesNH4
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  uint32_t *puVar6;
  HasherCommon *pHVar7;
  int iVar8;
  bool bVar9;
  Command_conflict *pCVar10;
  uint32_t uVar11;
  int iVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint8_t *puVar18;
  uint8_t *puVar19;
  ulong uVar20;
  uint8_t *puVar21;
  long lVar22;
  byte bVar23;
  int *piVar24;
  BrotliEncoderDictionary *pBVar25;
  uint8_t *local_bb0;
  uint8_t *local_ba0;
  uint8_t *local_b90;
  uint8_t *local_b88;
  uint8_t *local_b78;
  uint8_t *local_b60;
  uint8_t *local_b50;
  uint8_t *local_b48;
  ulong local_b40;
  ulong local_b38;
  uint8_t *local_b28;
  uint8_t *local_b20;
  uint8_t *local_b18;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  size_t sStack_aa8;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command_conflict *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H4 *privat;
  BrotliEncoderParams *params_local;
  ContextLut literal_context_lut_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_910;
  uint32_t delta;
  size_t nbits;
  size_t offset_2;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_7fa;
  uint32_t nbits_2;
  ushort local_7d2;
  uint32_t offset_3;
  uint16_t bits64;
  ushort local_7aa;
  size_t score_4;
  size_t backward_2;
  size_t len_3;
  size_t i_2;
  size_t keys_1 [4];
  size_t score_3;
  size_t len_2;
  size_t prev_ix_1;
  size_t cached_backward_1;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t key_out_1;
  size_t key_2;
  int compare_char_1;
  size_t cur_ix_masked_1;
  size_t best_len_in_1;
  uint32_t *buckets_1;
  size_t matching_bits_4;
  uint64_t x_4;
  size_t limit2_4;
  size_t matched_4;
  ulong *local_640;
  size_t local_630;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_600;
  size_t local_5f0;
  int item_matches_1;
  size_t i_3;
  size_t key_3;
  uint32_t h_1;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_5;
  size_t backward_3;
  size_t matchlen_1;
  size_t offset_1;
  size_t matching_bits_5;
  uint64_t x_5;
  size_t limit2_5;
  size_t matched_5;
  ulong *local_480;
  size_t local_470;
  size_t score_1;
  size_t backward;
  size_t len_1;
  size_t i;
  size_t keys [4];
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t cached_backward;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t key_out;
  size_t key;
  int compare_char;
  size_t cur_ix_masked;
  size_t best_len_in;
  uint32_t *buckets;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_2e8;
  size_t local_2d8;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_2a8;
  size_t local_298;
  int item_matches;
  size_t i_1;
  size_t key_1;
  uint32_t h;
  size_t transform_id;
  size_t cut;
  size_t score_2;
  size_t backward_1;
  size_t matchlen;
  size_t offset;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_128;
  size_t local_118;
  uint8_t *local_d0;
  size_t i_4;
  uint32_t off;
  uint32_t key_4;
  uint32_t off_2;
  uint32_t key_6;
  uint32_t off_1;
  uint32_t key_5;
  
  pCVar10 = commands;
  puVar13 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  sVar5 = params->stream_offset;
  pos_end = *last_insert_len;
  puVar14 = (uint8_t *)(position + num_bytes);
  local_b18 = (uint8_t *)position;
  if (7 < num_bytes) {
    local_b18 = (uint8_t *)((position + num_bytes) - 7);
  }
  iVar12 = 0x200;
  if (params->quality < 9) {
    iVar12 = 0x40;
  }
  lVar15 = (long)iVar12;
  gap = position + lVar15;
  puVar21 = (uint8_t *)position;
LAB_0012a0b8:
  do {
    ringbuffer_local = puVar21;
    if (puVar14 <= ringbuffer_local + 8) {
      *last_insert_len = (size_t)(puVar14 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar10 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar14 - (long)ringbuffer_local;
    local_b20 = puVar13;
    if (ringbuffer_local < puVar13) {
      local_b20 = ringbuffer_local;
    }
    local_b28 = puVar13;
    if (ringbuffer_local + sVar5 < puVar13) {
      local_b28 = ringbuffer_local + sVar5;
    }
    sr.len = 0;
    sr.score = 0;
    pBVar25 = &params->dictionary;
    puVar21 = (uint8_t *)(params->dist).max_distance;
    puVar6 = (hasher->privat)._H2.buckets_;
    cached_backward = 0;
    uVar16 = (ulong)ringbuffer_local & ringbuffer_mask;
    uVar1 = ringbuffer[uVar16];
    uVar11 = HashBytesH4(ringbuffer + uVar16);
    best_len = 0x7e4;
    sr.score._0_4_ = 0;
    if ((ringbuffer_local + -(long)*dist_cache < ringbuffer_local) &&
       (uVar17 = ringbuffer_mask & 0xffffffff & (ulong)(ringbuffer_local + -(long)*dist_cache),
       uVar1 == ringbuffer[uVar17])) {
      local_2a8 = (ulong *)(ringbuffer + uVar16);
      limit2 = 0;
      x = (max_distance >> 3) + 1;
LAB_0012a427:
      x = x - 1;
      if (x != 0) {
        if (*local_2a8 == *(ulong *)(ringbuffer + limit2 + uVar17)) break;
        iVar12 = 0;
        for (uVar17 = *local_2a8 ^ *(ulong *)(ringbuffer + limit2 + uVar17); (uVar17 & 1) == 0;
            uVar17 = uVar17 >> 1 | 0x8000000000000000) {
          iVar12 = iVar12 + 1;
        }
        local_298 = ((ulong)(long)iVar12 >> 3) + limit2;
        goto LAB_0012a5ca;
      }
      matched = (max_distance & 7) + 1;
      while (matched = matched - 1, matched != 0) {
        if (ringbuffer[limit2 + uVar17] != (uint8_t)*local_2a8) {
          local_298 = limit2;
          goto LAB_0012a5ca;
        }
        local_2a8 = (ulong *)((long)local_2a8 + 1);
        limit2 = limit2 + 1;
      }
      local_298 = limit2;
LAB_0012a5ca:
      if (3 < local_298) {
        keys[3] = local_298 * 0x87 + 0x78f;
        if (0x7e4 < keys[3]) {
          cached_backward = local_298;
          uVar1 = ringbuffer[uVar16 + local_298];
          sr.len = (long)*dist_cache;
          best_len = keys[3];
        }
      }
    }
    for (len_1 = 0; len_1 < 4; len_1 = len_1 + 1) {
      keys[len_1 - 1] = (ulong)uVar11 + len_1 * 8 & 0x1ffff;
    }
    lVar22 = *(long *)((long)keys + (((ulong)ringbuffer_local & 0x18) - 8));
    sStack_aa8 = cached_backward;
    sr.distance = best_len;
    for (len_1 = 0; len_1 < 4; len_1 = len_1 + 1) {
      uVar17 = (ulong)puVar6[keys[len_1 - 1]];
      puVar18 = ringbuffer_local + -uVar17;
      uVar17 = ringbuffer_mask & 0xffffffff & uVar17;
      if ((uVar1 == ringbuffer[uVar17 + cached_backward]) &&
         (puVar18 != (uint8_t *)0x0 && puVar18 <= local_b20)) {
        local_2e8 = (ulong *)(ringbuffer + uVar16);
        limit2_1 = 0;
        x_1 = (max_distance >> 3) + 1;
LAB_0012a828:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          if (*local_2e8 == *(ulong *)(ringbuffer + limit2_1 + uVar17)) goto LAB_0012a88a;
          iVar12 = 0;
          for (uVar17 = *local_2e8 ^ *(ulong *)(ringbuffer + limit2_1 + uVar17); (uVar17 & 1) == 0;
              uVar17 = uVar17 >> 1 | 0x8000000000000000) {
            iVar12 = iVar12 + 1;
          }
          local_2d8 = ((ulong)(long)iVar12 >> 3) + limit2_1;
          goto LAB_0012a9cb;
        }
        matched_1 = (max_distance & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (ringbuffer[limit2_1 + uVar17] != (uint8_t)*local_2e8) {
            local_2d8 = limit2_1;
            goto LAB_0012a9cb;
          }
          local_2e8 = (ulong *)((long)local_2e8 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_2d8 = limit2_1;
LAB_0012a9cb:
        if (3 < local_2d8) {
          iVar12 = 0x1f;
          if ((uint)puVar18 != 0) {
            for (; (uint)puVar18 >> iVar12 == 0; iVar12 = iVar12 + -1) {
            }
          }
          uVar17 = (local_2d8 * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
          if (best_len < uVar17) {
            cached_backward = local_2d8;
            sStack_aa8 = local_2d8;
            uVar1 = ringbuffer[uVar16 + local_2d8];
            sr.len = (size_t)puVar18;
            sr.distance = uVar17;
            best_len = uVar17;
          }
        }
      }
    }
    if (sr.distance == 0x7e4) {
      pHVar7 = (hasher->privat)._H2.common;
      piVar24 = (int *)(ringbuffer + uVar16);
      if (pHVar7->dict_num_lookups >> 7 <= pHVar7->dict_num_matches) {
        i_1 = (size_t)(((uint)(*piVar24 * 0x1e35a7bd) >> 0x12) << 1);
        bVar9 = false;
        while (!bVar9) {
          pHVar7->dict_num_lookups = pHVar7->dict_num_lookups + 1;
          if ((params->dictionary).hash_table_lengths[i_1] != '\0') {
            bVar2 = (params->dictionary).hash_table_lengths[i_1];
            uVar17 = (ulong)bVar2;
            uVar16 = (ulong)(params->dictionary).hash_table_words[i_1];
            if (max_distance < uVar17) {
              bVar9 = false;
            }
            else {
              local_128 = (ulong *)(pBVar25->words->data +
                                   (ulong)pBVar25->words->offsets_by_length[uVar17] +
                                   uVar17 * uVar16);
              limit2_2 = 0;
              x_2 = (ulong)(bVar2 >> 3) + 1;
LAB_0012ad73:
              x_2 = x_2 - 1;
              if (x_2 != 0) {
                if (*local_128 == *(ulong *)((long)piVar24 + limit2_2)) goto LAB_0012add5;
                iVar12 = 0;
                for (uVar20 = *local_128 ^ *(ulong *)((long)piVar24 + limit2_2); (uVar20 & 1) == 0;
                    uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                  iVar12 = iVar12 + 1;
                }
                local_118 = ((ulong)(long)iVar12 >> 3) + limit2_2;
                goto LAB_0012af16;
              }
              matched_2 = (uVar17 & 7) + 1;
              while (matched_2 = matched_2 - 1, matched_2 != 0) {
                if (*(char *)((long)piVar24 + limit2_2) != (char)*local_128) {
                  local_118 = limit2_2;
                  goto LAB_0012af16;
                }
                local_128 = (ulong *)((long)local_128 + 1);
                limit2_2 = limit2_2 + 1;
              }
              local_118 = limit2_2;
LAB_0012af16:
              if ((uVar17 < local_118 + (params->dictionary).cutoffTransformsCount) &&
                 (local_118 != 0)) {
                puVar18 = local_b28 +
                          ((uVar17 - local_118) * 4 +
                           ((params->dictionary).cutoffTransforms >>
                            ((char)(uVar17 - local_118) * '\x06' & 0x3fU) & 0x3f) <<
                          (pBVar25->words->size_bits_by_length[uVar17] & 0x3f)) + uVar16 + 1;
                if (puVar21 < puVar18) {
                  bVar9 = false;
                }
                else {
                  iVar12 = 0x1f;
                  if ((uint)puVar18 != 0) {
                    for (; (uint)puVar18 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                    }
                  }
                  uVar16 = (local_118 * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
                  if (uVar16 < sr.distance) {
                    bVar9 = false;
                  }
                  else {
                    sStack_aa8 = local_118;
                    sr.score._0_4_ = (uint)bVar2 - (int)local_118;
                    bVar9 = true;
                    sr.len = (size_t)puVar18;
                    sr.distance = uVar16;
                  }
                }
              }
              else {
                bVar9 = false;
              }
            }
            if (bVar9) {
              pHVar7->dict_num_matches = pHVar7->dict_num_matches + 1;
            }
          }
          i_1 = i_1 + 1;
          bVar9 = true;
        }
      }
    }
    puVar6[lVar22] = (uint32_t)ringbuffer_local;
    if (0x7e4 < sr.distance) {
      cost_diff_lazy._4_4_ = 0;
      puVar21 = ringbuffer_local;
      if (sr.score._4_4_ == 0) {
        do {
          max_distance = max_distance - 1;
          if (params->quality < 5) {
            local_b38 = sStack_aa8 - 1;
            if (max_distance <= local_b38) {
              local_b38 = max_distance;
            }
            local_b40 = local_b38;
          }
          else {
            local_b40 = 0;
          }
          sr2.len = 0;
          local_b48 = puVar13;
          if (ringbuffer_local + 1 < puVar13) {
            local_b48 = ringbuffer_local + 1;
          }
          local_b50 = puVar13;
          if (ringbuffer_local + sVar5 + 1 < puVar13) {
            local_b50 = ringbuffer_local + sVar5 + 1;
          }
          pBVar25 = &params->dictionary;
          puVar18 = ringbuffer_local + 1;
          puVar21 = (uint8_t *)(params->dist).max_distance;
          puVar6 = (hasher->privat)._H2.buckets_;
          cached_backward_1 = local_b40;
          uVar16 = (ulong)puVar18 & ringbuffer_mask;
          uVar1 = ringbuffer[uVar16 + local_b40];
          uVar11 = HashBytesH4(ringbuffer + uVar16);
          best_len_1 = 0x7e4;
          distance_code = 0;
          sr2.score._0_4_ = 0;
          if ((puVar18 + -(long)*dist_cache < puVar18) &&
             (uVar17 = ringbuffer_mask & 0xffffffff & (ulong)(puVar18 + -(long)*dist_cache),
             uVar1 == ringbuffer[uVar17 + local_b40])) {
            local_600 = (ulong *)(ringbuffer + uVar16);
            limit2_3 = 0;
            x_3 = (max_distance >> 3) + 1;
LAB_0012b552:
            x_3 = x_3 - 1;
            if (x_3 != 0) {
              if (*local_600 == *(ulong *)(ringbuffer + limit2_3 + uVar17)) goto LAB_0012b5b4;
              iVar12 = 0;
              for (uVar17 = *local_600 ^ *(ulong *)(ringbuffer + limit2_3 + uVar17);
                  (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                iVar12 = iVar12 + 1;
              }
              local_5f0 = ((ulong)(long)iVar12 >> 3) + limit2_3;
              goto LAB_0012b6f5;
            }
            matched_3 = (max_distance & 7) + 1;
            while (matched_3 = matched_3 - 1, matched_3 != 0) {
              if (ringbuffer[limit2_3 + uVar17] != (uint8_t)*local_600) {
                local_5f0 = limit2_3;
                goto LAB_0012b6f5;
              }
              local_600 = (ulong *)((long)local_600 + 1);
              limit2_3 = limit2_3 + 1;
            }
            local_5f0 = limit2_3;
LAB_0012b6f5:
            if ((3 < local_5f0) && (uVar17 = local_5f0 * 0x87 + 0x78f, 0x7e4 < uVar17)) {
              distance_code = local_5f0;
              cached_backward_1 = local_5f0;
              uVar1 = ringbuffer[uVar16 + local_5f0];
              sr2.len = (long)*dist_cache;
              best_len_1 = uVar17;
            }
          }
          for (len_3 = 0; len_3 < 4; len_3 = len_3 + 1) {
            keys_1[len_3 - 1] = (ulong)uVar11 + len_3 * 8 & 0x1ffff;
          }
          lVar22 = *(long *)((long)keys_1 + (((ulong)puVar18 & 0x18) - 8));
          sr2.distance = best_len_1;
          for (len_3 = 0; len_3 < 4; len_3 = len_3 + 1) {
            uVar17 = (ulong)puVar6[keys_1[len_3 - 1]];
            puVar19 = puVar18 + -uVar17;
            uVar17 = ringbuffer_mask & 0xffffffff & uVar17;
            if ((uVar1 == ringbuffer[uVar17 + cached_backward_1]) &&
               (puVar19 != (uint8_t *)0x0 && puVar19 <= local_b48)) {
              local_640 = (ulong *)(ringbuffer + uVar16);
              limit2_4 = 0;
              x_4 = (max_distance >> 3) + 1;
LAB_0012b953:
              x_4 = x_4 - 1;
              if (x_4 != 0) {
                if (*local_640 == *(ulong *)(ringbuffer + limit2_4 + uVar17)) goto LAB_0012b9b5;
                iVar12 = 0;
                for (uVar17 = *local_640 ^ *(ulong *)(ringbuffer + limit2_4 + uVar17);
                    (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                  iVar12 = iVar12 + 1;
                }
                local_630 = ((ulong)(long)iVar12 >> 3) + limit2_4;
                goto LAB_0012baf6;
              }
              matched_4 = (max_distance & 7) + 1;
              while (matched_4 = matched_4 - 1, matched_4 != 0) {
                if (ringbuffer[limit2_4 + uVar17] != (uint8_t)*local_640) {
                  local_630 = limit2_4;
                  goto LAB_0012baf6;
                }
                local_640 = (ulong *)((long)local_640 + 1);
                limit2_4 = limit2_4 + 1;
              }
              local_630 = limit2_4;
LAB_0012baf6:
              if (3 < local_630) {
                iVar12 = 0x1f;
                if ((uint)puVar19 != 0) {
                  for (; (uint)puVar19 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                  }
                }
                uVar17 = (local_630 * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
                if (best_len_1 < uVar17) {
                  cached_backward_1 = local_630;
                  distance_code = local_630;
                  uVar1 = ringbuffer[uVar16 + local_630];
                  sr2.len = (size_t)puVar19;
                  sr2.distance = uVar17;
                  best_len_1 = uVar17;
                }
              }
            }
          }
          if (sr2.distance == 0x7e4) {
            pHVar7 = (hasher->privat)._H2.common;
            piVar24 = (int *)(ringbuffer + uVar16);
            if (pHVar7->dict_num_lookups >> 7 <= pHVar7->dict_num_matches) {
              i_3 = (size_t)(((uint)(*piVar24 * 0x1e35a7bd) >> 0x12) << 1);
              bVar9 = false;
              while (!bVar9) {
                pHVar7->dict_num_lookups = pHVar7->dict_num_lookups + 1;
                if ((params->dictionary).hash_table_lengths[i_3] != '\0') {
                  bVar2 = (params->dictionary).hash_table_lengths[i_3];
                  uVar17 = (ulong)bVar2;
                  uVar16 = (ulong)(params->dictionary).hash_table_words[i_3];
                  if (max_distance < uVar17) {
                    bVar9 = false;
                  }
                  else {
                    local_480 = (ulong *)(pBVar25->words->data +
                                         (ulong)pBVar25->words->offsets_by_length[uVar17] +
                                         uVar17 * uVar16);
                    limit2_5 = 0;
                    x_5 = (ulong)(bVar2 >> 3) + 1;
LAB_0012be9e:
                    x_5 = x_5 - 1;
                    if (x_5 != 0) {
                      if (*local_480 == *(ulong *)((long)piVar24 + limit2_5)) goto LAB_0012bf00;
                      iVar12 = 0;
                      for (uVar20 = *local_480 ^ *(ulong *)((long)piVar24 + limit2_5);
                          (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                        iVar12 = iVar12 + 1;
                      }
                      local_470 = ((ulong)(long)iVar12 >> 3) + limit2_5;
                      goto LAB_0012c041;
                    }
                    matched_5 = (uVar17 & 7) + 1;
                    while (matched_5 = matched_5 - 1, matched_5 != 0) {
                      if (*(char *)((long)piVar24 + limit2_5) != (char)*local_480) {
                        local_470 = limit2_5;
                        goto LAB_0012c041;
                      }
                      local_480 = (ulong *)((long)local_480 + 1);
                      limit2_5 = limit2_5 + 1;
                    }
                    local_470 = limit2_5;
LAB_0012c041:
                    if ((uVar17 < local_470 + (params->dictionary).cutoffTransformsCount) &&
                       (local_470 != 0)) {
                      puVar19 = local_b50 +
                                ((uVar17 - local_470) * 4 +
                                 ((params->dictionary).cutoffTransforms >>
                                  ((char)(uVar17 - local_470) * '\x06' & 0x3fU) & 0x3f) <<
                                (pBVar25->words->size_bits_by_length[uVar17] & 0x3f)) + uVar16 + 1;
                      if (puVar21 < puVar19) {
                        bVar9 = false;
                      }
                      else {
                        iVar12 = 0x1f;
                        if ((uint)puVar19 != 0) {
                          for (; (uint)puVar19 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                          }
                        }
                        uVar16 = (local_470 * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
                        if (uVar16 < sr2.distance) {
                          bVar9 = false;
                        }
                        else {
                          distance_code = local_470;
                          sr2.score._0_4_ = (uint)bVar2 - (int)local_470;
                          bVar9 = true;
                          sr2.len = (size_t)puVar19;
                          sr2.distance = uVar16;
                        }
                      }
                    }
                    else {
                      bVar9 = false;
                    }
                  }
                  if (bVar9) {
                    pHVar7->dict_num_matches = pHVar7->dict_num_matches + 1;
                  }
                }
                i_3 = i_3 + 1;
                bVar9 = true;
              }
            }
          }
          puVar6[lVar22] = (uint32_t)puVar18;
          puVar21 = ringbuffer_local;
          if (sr2.distance < sr.distance + 0xaf) break;
          puVar21 = ringbuffer_local + 1;
          pos_end = pos_end + 1;
          sStack_aa8 = distance_code;
          sr.len = sr2.len;
          sr.distance = sr2.distance;
          sr.score = (size_t)(uint)sr2.score;
          cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1;
          if ((3 < cost_diff_lazy._4_4_) ||
             (puVar18 = ringbuffer_local + 9, ringbuffer_local = puVar21, puVar14 <= puVar18))
          break;
        } while( true );
      }
      ringbuffer_local = puVar21;
      gap = (size_t)(ringbuffer_local + lVar15 + sStack_aa8 * 2);
      local_b60 = puVar13;
      if (ringbuffer_local + sVar5 < puVar13) {
        local_b60 = ringbuffer_local + sVar5;
      }
      if (local_b60 < sr.len) {
LAB_0012c54e:
        local_910 = sr.len + 0xf;
      }
      else {
        uVar16 = (sr.len + 3) - (long)*dist_cache;
        uVar17 = (sr.len + 3) - (long)dist_cache[1];
        if (sr.len == (long)*dist_cache) {
          local_910 = 0;
        }
        else if (sr.len == (long)dist_cache[1]) {
          local_910 = 1;
        }
        else if (uVar16 < 7) {
          local_910 = (ulong)(int)(0x9750468 >> ((byte)((uVar16 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (uVar17 < 7) {
          local_910 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar17 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (sr.len == (long)dist_cache[2]) {
          local_910 = 2;
        }
        else {
          if (sr.len != (long)dist_cache[3]) goto LAB_0012c54e;
          local_910 = 3;
        }
      }
      if ((sr.len <= local_b60) && (local_910 != 0)) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = *dist_cache;
        *dist_cache = (int)sr.len;
      }
      uVar11 = (uint32_t)pos_end;
      commands->insert_len_ = uVar11;
      commands->copy_len_ = (uint)sStack_aa8 | (int)sr.score << 0x19;
      uVar3 = (params->dist).num_direct_distance_codes;
      uVar4 = (params->dist).distance_postfix_bits;
      if (local_910 < (ulong)uVar3 + 0x10) {
        commands->dist_prefix_ = (uint16_t)local_910;
        commands->dist_extra_ = 0;
      }
      else {
        bVar2 = (byte)uVar4;
        uVar16 = (1L << (bVar2 + 2 & 0x3f)) + ((local_910 - 0x10) - (ulong)uVar3);
        iVar12 = 0x1f;
        if ((uint)uVar16 != 0) {
          for (; (uint)uVar16 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        bVar23 = (byte)(iVar12 - 1U);
        uVar17 = uVar16 >> (bVar23 & 0x3f) & 1;
        lVar22 = (ulong)(iVar12 - 1U) - (ulong)uVar4;
        commands->dist_prefix_ =
             (short)lVar22 * 0x400 |
             (short)uVar3 + 0x10 + (short)((lVar22 + -1) * 2 + uVar17 << (bVar2 & 0x3f)) +
             ((ushort)uVar16 & (short)(1 << (bVar2 & 0x1f)) - 1U);
        commands->dist_extra_ =
             (uint32_t)(uVar16 - (uVar17 + 2 << (bVar23 & 0x3f)) >> (bVar2 & 0x3f));
      }
      iVar12 = (uint)sStack_aa8 + (int)sr.score;
      uVar16 = (ulong)iVar12;
      if (pos_end < 6) {
        local_7fa = (ushort)pos_end;
      }
      else if (pos_end < 0x82) {
        iVar8 = 0x1f;
        if (uVar11 - 2 != 0) {
          for (; uVar11 - 2 >> iVar8 == 0; iVar8 = iVar8 + -1) {
          }
        }
        local_7fa = (short)(iVar8 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar8 + -1) & 0x3f)) +
                    2;
      }
      else if (pos_end < 0x842) {
        iVar8 = 0x1f;
        if (uVar11 - 0x42 != 0) {
          for (; uVar11 - 0x42 >> iVar8 == 0; iVar8 = iVar8 + -1) {
          }
        }
        local_7fa = (short)iVar8 + 10;
      }
      else if (pos_end < 0x1842) {
        local_7fa = 0x15;
      }
      else if (pos_end < 0x5842) {
        local_7fa = 0x16;
      }
      else {
        local_7fa = 0x17;
      }
      if (uVar16 < 10) {
        local_7d2 = (short)iVar12 - 2;
      }
      else if (uVar16 < 0x86) {
        iVar8 = 0x1f;
        if (iVar12 - 6U != 0) {
          for (; iVar12 - 6U >> iVar8 == 0; iVar8 = iVar8 + -1) {
          }
        }
        local_7d2 = (short)(iVar8 + -1) * 2 + (short)(uVar16 - 6 >> ((byte)(iVar8 + -1) & 0x3f)) + 4
        ;
      }
      else if (uVar16 < 0x846) {
        iVar8 = 0x1f;
        if (iVar12 - 0x46U != 0) {
          for (; iVar12 - 0x46U >> iVar8 == 0; iVar8 = iVar8 + -1) {
          }
        }
        local_7d2 = (short)iVar8 + 0xc;
      }
      else {
        local_7d2 = 0x17;
      }
      local_7aa = local_7d2 & 7 | (local_7fa & 7) << 3;
      if ((((commands->dist_prefix_ & 0x3ff) == 0) && (local_7fa < 8)) && (local_7d2 < 0x10)) {
        if (7 < local_7d2) {
          local_7aa = local_7aa | 0x40;
        }
      }
      else {
        iVar12 = ((int)(uint)local_7d2 >> 3) + ((int)(uint)local_7fa >> 3) * 3;
        local_7aa = (short)iVar12 * 0x40 + 0x40 +
                    ((ushort)(0x520d40 >> ((char)iVar12 * '\x02' & 0x1fU)) & 0xc0) | local_7aa;
      }
      commands->cmd_prefix_ = local_7aa;
      *num_literals = pos_end + *num_literals;
      pos_end = 0;
      range_end = (size_t)(ringbuffer_local + 2);
      local_b78 = ringbuffer_local + sStack_aa8;
      if (local_b18 <= local_b78) {
        local_b78 = local_b18;
      }
      if (sr.len < sStack_aa8 >> 2) {
        local_b88 = ringbuffer_local + sr.len * -4 + sStack_aa8;
        if (local_b88 < range_end) {
          local_b88 = (uint8_t *)range_end;
        }
        if (local_b78 < local_b88) {
          local_b90 = local_b78;
        }
        else {
          local_b90 = local_b88;
        }
        range_end = (size_t)local_b90;
      }
      for (local_d0 = (uint8_t *)range_end; local_d0 < local_b78; local_d0 = local_d0 + 1) {
        uVar11 = HashBytesH4(ringbuffer + ((ulong)local_d0 & ringbuffer_mask));
        (hasher->privat)._H2.buckets_[uVar11 + ((uint)local_d0 & 0x18) & 0x1ffff] = (uint)local_d0;
      }
      commands = commands + 1;
      puVar21 = ringbuffer_local + sStack_aa8;
      goto LAB_0012a0b8;
    }
    pos_end = pos_end + 1;
    puVar21 = ringbuffer_local + 1;
    if ((gap < puVar21) && (back_refs_size == 0)) {
      if ((uint8_t *)(gap + lVar15 * 4) < puVar21) {
        puVar18 = ringbuffer_local + 0x11;
        local_ba0 = puVar14 + -7;
        ringbuffer_local = puVar21;
        if (puVar18 < local_ba0) {
          local_ba0 = puVar18;
        }
        for (; puVar21 = ringbuffer_local, ringbuffer_local < local_ba0;
            ringbuffer_local = ringbuffer_local + 4) {
          uVar11 = HashBytesH4(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          (hasher->privat)._H2.buckets_[uVar11 + ((uint)ringbuffer_local & 0x18) & 0x1ffff] =
               (uint)ringbuffer_local;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar18 = ringbuffer_local + 9;
        local_bb0 = puVar14 + -7;
        ringbuffer_local = puVar21;
        if (puVar18 < local_bb0) {
          local_bb0 = puVar18;
        }
        for (; puVar21 = ringbuffer_local, ringbuffer_local < local_bb0;
            ringbuffer_local = ringbuffer_local + 2) {
          uVar11 = HashBytesH4(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          (hasher->privat)._H2.buckets_[uVar11 + ((uint)ringbuffer_local & 0x18) & 0x1ffff] =
               (uint)ringbuffer_local;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
  local_2a8 = local_2a8 + 1;
  limit2 = limit2 + 8;
  goto LAB_0012a427;
LAB_0012a88a:
  local_2e8 = local_2e8 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_0012a828;
LAB_0012add5:
  local_128 = local_128 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_0012ad73;
LAB_0012b5b4:
  local_600 = local_600 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_0012b552;
LAB_0012b9b5:
  local_640 = local_640 + 1;
  limit2_4 = limit2_4 + 8;
  goto LAB_0012b953;
LAB_0012bf00:
  local_480 = local_480 + 1;
  limit2_5 = limit2_5 + 8;
  goto LAB_0012be9e;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}